

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O1

void swap_endian(void *data,uint elem_size,uint num)

{
  undefined1 uVar1;
  long lVar2;
  long lVar3;
  
  if (num != 0) {
    do {
      if (1 < elem_size) {
        lVar2 = 0;
        lVar3 = 0;
        do {
          uVar1 = *(undefined1 *)((long)data + lVar3);
          *(undefined1 *)((long)data + lVar3) =
               *(undefined1 *)((long)data + lVar2 + (ulong)(elem_size - 1));
          *(undefined1 *)((long)data + lVar2 + (ulong)(elem_size - 1)) = uVar1;
          lVar3 = lVar3 + 1;
          lVar2 = lVar2 + -1;
        } while (elem_size >> 1 != (uint)lVar3);
        data = (void *)((long)data - lVar2);
      }
      data = (void *)((long)data + (ulong)(elem_size >> 1));
      num = num - 1;
    } while (num != 0);
  }
  return;
}

Assistant:

void swap_endian(void *data, unsigned elem_size, unsigned num)
{
	char *src = (char*) data;
	char *dst = src + (elem_size - 1);

	while(num)
	{
		unsigned n = elem_size>>1;
		char tmp;
		while(n)
		{
			tmp = *src;
			*src = *dst;
			*dst = tmp;

			src++;
			dst--;
			n--;
		}

		src = src + (elem_size>>1);
		dst = src + (elem_size - 1);
		num--;
	}
}